

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall
VmaBlockMetadata_Linear::Alloc
          (VmaBlockMetadata_Linear *this,VmaAllocationRequest *request,VmaSuballocationType type,
          void *userData)

{
  _func_int ***ppp_Var1;
  VmaAllocationRequestType VVar2;
  VmaAllocHandle pVVar3;
  VkDeviceSize VVar4;
  size_t sVar5;
  VmaSuballocation *pVVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  pVVar3 = request->allocHandle;
  VVar4 = request->size;
  VVar2 = request->type;
  if (VVar2 == EndOf2nd) {
    ppp_Var1 = &(this->super_VmaBlockMetadata)._vptr_VmaBlockMetadata +
               (ulong)(this->m_1stVectorIndex == 0) * 4;
    if (this->m_2ndVectorMode == SECOND_VECTOR_EMPTY) {
      this->m_2ndVectorMode = SECOND_VECTOR_RING_BUFFER;
    }
    lVar8 = (long)ppp_Var1[8];
  }
  else {
    if (VVar2 != EndOf1st) {
      if (VVar2 == UpperAddress) {
        bVar9 = this->m_1stVectorIndex == 0;
        sVar5 = (&this->m_Suballocations0)[bVar9].m_Count;
        VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::resize
                  (&this->m_Suballocations0 + bVar9,sVar5 + 1);
        pVVar6 = (&this->m_Suballocations0)[bVar9].m_pArray;
        pVVar6[sVar5].offset = (VkDeviceSize)(pVVar3 + -1);
        pVVar6[sVar5].size = VVar4;
        pVVar6[sVar5].userData = userData;
        pVVar6[sVar5].type = type;
        this->m_2ndVectorMode = SECOND_VECTOR_DOUBLE_STACK;
      }
      goto LAB_001b8436;
    }
    ppp_Var1 = &(this->super_VmaBlockMetadata)._vptr_VmaBlockMetadata +
               (ulong)(this->m_1stVectorIndex != 0) * 4;
    lVar8 = (long)ppp_Var1[8];
  }
  VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::resize
            ((VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)(ppp_Var1 + 6),
             lVar8 + 1);
  lVar7 = (long)ppp_Var1[7];
  lVar8 = lVar8 * 0x20;
  *(VmaAllocHandle *)(lVar7 + lVar8) = pVVar3 + -1;
  *(VkDeviceSize *)(lVar7 + 8 + lVar8) = VVar4;
  *(void **)(lVar7 + 0x10 + lVar8) = userData;
  *(VmaSuballocationType *)(lVar7 + 0x18 + lVar8) = type;
LAB_001b8436:
  this->m_SumFreeSize = this->m_SumFreeSize - VVar4;
  return;
}

Assistant:

void VmaBlockMetadata_Linear::Alloc(
    const VmaAllocationRequest& request,
    VmaSuballocationType type,
    void* userData)
{
    const VkDeviceSize offset = (VkDeviceSize)request.allocHandle - 1;
    const VmaSuballocation newSuballoc = { offset, request.size, userData, type };

    switch (request.type)
    {
    case VmaAllocationRequestType::UpperAddress:
    {
        VMA_ASSERT(m_2ndVectorMode != SECOND_VECTOR_RING_BUFFER &&
            "CRITICAL ERROR: Trying to use linear allocator as double stack while it was already used as ring buffer.");
        SuballocationVectorType& suballocations2nd = AccessSuballocations2nd();
        suballocations2nd.push_back(newSuballoc);
        m_2ndVectorMode = SECOND_VECTOR_DOUBLE_STACK;
    }
    break;
    case VmaAllocationRequestType::EndOf1st:
    {
        SuballocationVectorType& suballocations1st = AccessSuballocations1st();

        VMA_ASSERT(suballocations1st.empty() ||
            offset >= suballocations1st.back().offset + suballocations1st.back().size);
        // Check if it fits before the end of the block.
        VMA_ASSERT(offset + request.size <= GetSize());

        suballocations1st.push_back(newSuballoc);
    }
    break;
    case VmaAllocationRequestType::EndOf2nd:
    {
        SuballocationVectorType& suballocations1st = AccessSuballocations1st();
        // New allocation at the end of 2-part ring buffer, so before first allocation from 1st vector.
        VMA_ASSERT(!suballocations1st.empty() &&
            offset + request.size <= suballocations1st[m_1stNullItemsBeginCount].offset);
        SuballocationVectorType& suballocations2nd = AccessSuballocations2nd();

        switch (m_2ndVectorMode)
        {
        case SECOND_VECTOR_EMPTY:
            // First allocation from second part ring buffer.
            VMA_ASSERT(suballocations2nd.empty());
            m_2ndVectorMode = SECOND_VECTOR_RING_BUFFER;
            break;
        case SECOND_VECTOR_RING_BUFFER:
            // 2-part ring buffer is already started.
            VMA_ASSERT(!suballocations2nd.empty());
            break;
        case SECOND_VECTOR_DOUBLE_STACK:
            VMA_ASSERT(0 && "CRITICAL ERROR: Trying to use linear allocator as ring buffer while it was already used as double stack.");
            break;
        default:
            VMA_ASSERT(0);
        }

        suballocations2nd.push_back(newSuballoc);
    }
    break;
    default:
        VMA_ASSERT(0 && "CRITICAL INTERNAL ERROR.");
    }

    m_SumFreeSize -= newSuballoc.size;
}